

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcFanio.c
# Opt level: O3

void Abc_ObjReplace(Abc_Obj_t *pNodeOld,Abc_Obj_t *pNodeNew)

{
  if (((ulong)pNodeOld & 1) != 0) {
    __assert_fail("!Abc_ObjIsComplement(pNodeOld)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/base/abc/abcFanio.c"
                  ,0x147,"void Abc_ObjReplace(Abc_Obj_t *, Abc_Obj_t *)");
  }
  if (((ulong)pNodeNew & 1) != 0) {
    __assert_fail("!Abc_ObjIsComplement(pNodeNew)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/base/abc/abcFanio.c"
                  ,0x148,"void Abc_ObjReplace(Abc_Obj_t *, Abc_Obj_t *)");
  }
  if (pNodeOld->pNtk != pNodeNew->pNtk) {
    __assert_fail("pNodeOld->pNtk == pNodeNew->pNtk",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/base/abc/abcFanio.c"
                  ,0x149,"void Abc_ObjReplace(Abc_Obj_t *, Abc_Obj_t *)");
  }
  if (pNodeOld != pNodeNew) {
    if (0 < (pNodeOld->vFanouts).nSize) {
      Abc_ObjTransferFanout(pNodeOld,pNodeNew);
      Abc_NtkDeleteObj_rec(pNodeOld,1);
      return;
    }
    __assert_fail("Abc_ObjFanoutNum(pNodeOld) > 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/base/abc/abcFanio.c"
                  ,0x14b,"void Abc_ObjReplace(Abc_Obj_t *, Abc_Obj_t *)");
  }
  __assert_fail("pNodeOld != pNodeNew",
                "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/base/abc/abcFanio.c"
                ,0x14a,"void Abc_ObjReplace(Abc_Obj_t *, Abc_Obj_t *)");
}

Assistant:

void Abc_ObjReplace( Abc_Obj_t * pNodeOld, Abc_Obj_t * pNodeNew )
{
    assert( !Abc_ObjIsComplement(pNodeOld) );
    assert( !Abc_ObjIsComplement(pNodeNew) );
    assert( pNodeOld->pNtk == pNodeNew->pNtk );
    assert( pNodeOld != pNodeNew );
    assert( Abc_ObjFanoutNum(pNodeOld) > 0 );
    // transfer the fanouts to the old node
    Abc_ObjTransferFanout( pNodeOld, pNodeNew );
    // remove the old node
    Abc_NtkDeleteObj_rec( pNodeOld, 1 );
}